

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O0

void __thiscall
pstack::Elf::SymHash::SymHash(SymHash *this,csptr *hash_,csptr *syms_,csptr *strings_)

{
  int iVar1;
  element_type *peVar2;
  undefined4 extraout_var;
  ulong __new_size;
  reference pvVar3;
  size_t words;
  csptr *strings__local;
  csptr *syms__local;
  csptr *hash__local;
  SymHash *this_local;
  
  std::shared_ptr<const_pstack::Reader>::shared_ptr(&this->hash,hash_);
  std::shared_ptr<const_pstack::Reader>::shared_ptr(&this->syms,syms_);
  std::shared_ptr<const_pstack::Reader>::shared_ptr(&this->strings,strings_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->data);
  peVar2 = std::__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  iVar1 = (*peVar2->_vptr_Reader[8])();
  __new_size = CONCAT44(extraout_var,iVar1) >> 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->data,__new_size);
  peVar2 = std::__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&this->data,0);
  Reader::readObj<unsigned_int>(peVar2,0,pvVar3,__new_size);
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&this->data,0);
  this->nbucket = *pvVar3;
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&this->data,1);
  this->nchain = *pvVar3;
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&this->data,0);
  this->buckets = pvVar3 + 2;
  this->chains = this->buckets + this->nbucket;
  return;
}

Assistant:

SymHash::SymHash(Reader::csptr hash_,
      Reader::csptr syms_, Reader::csptr strings_)
    : hash(std::move(hash_))
    , syms(std::move(syms_))
    , strings(std::move(strings_))
{
    // read the hash table into local memory.
    size_t words = hash->size() / sizeof (Word);
    data.resize(words);
    hash->readObj(0, &data[0], words);
    nbucket = data[0];
    nchain = data[1];
    buckets = &data[0] + 2;
    chains = buckets + nbucket;
}